

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

int __thiscall HModel::util_chgCostsAll(HModel *this,double *XcolCost)

{
  reference pvVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int col;
  int in_stack_ffffffffffffffcc;
  HModel *in_stack_ffffffffffffffd0;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x60c); local_14 = local_14 + 1) {
    in_stack_ffffffffffffffd0 = *(HModel **)(in_RSI + (long)local_14 * 8);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),(long)local_14);
    dVar2 = (double)in_stack_ffffffffffffffd0 * *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),(long)local_14);
    *pvVar1 = dVar2;
  }
  mlFg_Update(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return 0;
}

Assistant:

int HModel::util_chgCostsAll(const double* XcolCost) {
  assert(XcolCost != NULL);
  for (int col = 0; col < numCol; ++col) {
    colCost[col] =  XcolCost[col] * colScale[col];
  }
  //Deduce the consequences of new costs
  mlFg_Update(mlFg_action_NewCosts);
  return 0;
}